

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O1

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::
Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::prepareChildren(Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
                  *this,Node *n,bool backtrackable)

{
  int *piVar1;
  long *plVar2;
  uint uVar3;
  uint *puVar4;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
  *pVVar5;
  BacktrackData *pBVar6;
  int iVar7;
  BacktrackObject *pBVar8;
  OptionBase<Lib::VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs_*>_> local_48;
  IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
  *local_30;
  Value local_28;
  
  iVar7 = (*n->_vptr_Node[2])(n);
  if ((char)iVar7 == '\0') {
    uVar3 = *(uint *)&n[1]._vptr_Node;
    if ((this->_svStack)._cursor == (this->_svStack)._end) {
      ::Lib::Stack<unsigned_int>::expand(&this->_svStack);
    }
    puVar4 = (this->_svStack)._cursor;
    *puVar4 = uVar3;
    (this->_svStack)._cursor = puVar4 + 1;
    local_48._isSome = false;
    local_48._1_7_ = 0;
    local_48._elem._elem = (Value)0x0;
    ::Lib::OptionBase<Lib::VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs_*>_>::
    operator=(&(this->_leafData).
               super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs_*>_>
              ,&local_48);
    if ((local_48._isSome == true) && (local_48._elem._elem != (Value)0x0)) {
      plVar2 = (long *)((long)local_48._elem._elem + 8);
      *(int *)plVar2 = *(int *)plVar2 + -1;
      if (*(int *)plVar2 == 0) {
        (**(code **)(*(long *)local_48._elem._elem + 8))();
      }
    }
    Indexing::RetrievalAlgorithms::
    __selectPotentiallyUnifiableChildren<Inferences::ALASCA::SuperpositionConf::Lhs>
              ((RetrievalAlgorithms *)&local_30,(IntermediateNode *)n,(RobSubstitution *)this,2);
    if ((this->_nodeIterators)._cursor == (this->_nodeIterators)._end) {
      ::Lib::
      Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>_>
      ::expand(&this->_nodeIterators);
    }
    pVVar5 = (this->_nodeIterators)._cursor;
    pVVar5->_core = local_30;
    if (local_30 !=
        (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
         *)0x0) {
      local_30->_refCnt = local_30->_refCnt + 1;
    }
    (this->_nodeIterators)._cursor = pVVar5 + 1;
    if (local_30 !=
        (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
         *)0x0) {
      piVar1 = &local_30->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*local_30->_vptr_IteratorCore[1])();
      }
    }
    if (backtrackable) {
      pBVar6 = (this->_bdStack)._cursor;
      pBVar8 = (BacktrackObject *)
               ::Lib::FixedSizeAllocator<24UL>::alloc
                         ((FixedSizeAllocator<24UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30))
      ;
      pBVar8->_vptr_BacktrackObject = (_func_int **)&PTR__BacktrackObject_00b5b190;
      pBVar8[1]._vptr_BacktrackObject = (_func_int **)this;
      pBVar8->_next = pBVar6[-1]._boList;
      pBVar6[-1]._boList = pBVar8;
    }
  }
  else {
    (*n->_vptr_Node[8])(&local_28,n);
    local_48._isSome = true;
    if (local_28 == (Value)0x0) {
      local_48._elem._elem = local_28;
    }
    else {
      iVar7 = *(int *)((long)local_28 + 8);
      *(int *)((long)local_28 + 8) = iVar7 + 1;
      local_48._elem._elem = local_28;
      *(int *)((long)local_28 + 8) = iVar7 + 2;
      plVar2 = (long *)((long)local_28 + 8);
      *(int *)plVar2 = *(int *)plVar2 + -1;
      if (*(int *)plVar2 == 0) {
        (**(code **)(*(long *)local_28 + 8))();
      }
    }
    ::Lib::OptionBase<Lib::VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs_*>_>::
    operator=(&(this->_leafData).
               super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs_*>_>
              ,&local_48);
    if ((local_48._isSome == true) && (local_48._elem._elem != (Value)0x0)) {
      plVar2 = (long *)((long)local_48._elem._elem + 8);
      *(int *)plVar2 = *(int *)plVar2 + -1;
      if (*(int *)plVar2 == 0) {
        (**(code **)(*(long *)local_48._elem._elem + 8))();
      }
    }
    if (local_28 != (Value)0x0) {
      plVar2 = (long *)((long)local_28 + 8);
      *(int *)plVar2 = *(int *)plVar2 + -1;
      if (*(int *)plVar2 == 0) {
        (**(code **)(*(long *)local_28 + 8))();
      }
    }
  }
  return;
}

Assistant:

void prepareChildren(Node* n, bool backtrackable) {
        if(n->isLeaf()) {
          _leafData = some(static_cast<Leaf*>(n)->allChildren());
        } else {
          IntermediateNode* inode=static_cast<IntermediateNode*>(n);
          _svStack.push(inode->childVar);
          _leafData = {};
          DEBUG_QUERY(1, "entering node: S", _svStack.top())
          
          _nodeIterators.push(_algo.template selectPotentiallyUnifiableChildren<LeafData>(inode));
          if (backtrackable) {
            _bdStack.top().addClosure([&]() { 
                DEBUG_CODE(auto var = )_svStack.pop();
                DEBUG_QUERY(1, "backtracking node: S", var)
                _nodeIterators.pop(); 
            });
          }
        }
      }